

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O1

void __thiscall Graph::addEdge(Graph *this,int i,int j)

{
  ulong *puVar1;
  pointer pvVar2;
  
  if (-1 < i) {
    if (((j < this->r) && (0 < j)) && (i < this->r)) {
      pvVar2 = (this->adjMatrix).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (ulong *)(*(long *)&pvVar2[(uint)i].super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data + (ulong)((uint)j >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)j & 0x3f);
      puVar1 = (ulong *)(*(long *)&pvVar2[(uint)j].super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data + (ulong)((uint)i >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)i & 0x3f);
      return;
    }
  }
  __assert_fail("i >= 0 && i < r && j > 0 && j < r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                ,0x26,"void Graph::addEdge(int, int)");
}

Assistant:

void addEdge(int i, int j) {
        assert(i >= 0 && i < r && j > 0 && j < r);
        adjMatrix[i][j] = true;
        adjMatrix[j][i] = true;
    }